

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

uint8_t matrix4_transformation_decompose_EXP
                  (matrix4 *self,vector3 *scale,quaternion *rotation,vector3 *translation)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  float signz;
  float signy;
  float signx;
  vector3 *translation_local;
  quaternion *rotation_local;
  vector3 *scale_local;
  matrix4 *self_local;
  
  (translation->field_0).v[0] = (self->field_0).m[3];
  (translation->field_0).v[1] = (self->field_0).m[7];
  (translation->field_0).v[2] = (self->field_0).m[0xb];
  uVar1 = -(uint)((self->field_0).m[0] * (self->field_0).m[4] * (self->field_0).m[8] *
                  (self->field_0).m[0xc] < 0.0);
  uVar2 = -(uint)((self->field_0).m[1] * (self->field_0).m[5] * (self->field_0).m[9] *
                  (self->field_0).m[0xd] < 0.0);
  uVar3 = -(uint)((self->field_0).m[2] * (self->field_0).m[6] * (self->field_0).m[10] *
                  (self->field_0).m[0xe] < 0.0);
  dVar4 = sqrt((double)((self->field_0).m[8] * (self->field_0).m[8] +
                       (self->field_0).m[0] * (self->field_0).m[0] +
                       (self->field_0).m[4] * (self->field_0).m[4]));
  (scale->field_0).v[0] = (float)(~uVar1 & 0x3f800000 | uVar1 & 0xbf800000) * (float)dVar4;
  dVar4 = sqrt((double)((self->field_0).m[9] * (self->field_0).m[9] +
                       (self->field_0).m[1] * (self->field_0).m[1] +
                       (self->field_0).m[5] * (self->field_0).m[5]));
  (scale->field_0).v[1] = (float)(~uVar2 & 0x3f800000 | uVar2 & 0xbf800000) * (float)dVar4;
  dVar4 = sqrt((double)((self->field_0).m[10] * (self->field_0).m[10] +
                       (self->field_0).m[2] * (self->field_0).m[2] +
                       (self->field_0).m[6] * (self->field_0).m[6]));
  (scale->field_0).v[2] = (float)(~uVar3 & 0x3f800000 | uVar3 & 0xbf800000) * (float)dVar4;
  quaternion_identity(rotation);
  return '\x01';
}

Assistant:

HYPAPI uint8_t matrix4_transformation_decompose_EXP(struct matrix4 *self, struct vector3 *scale, struct quaternion *rotation, struct vector3 *translation)
{
	HYP_FLOAT signx, signy, signz;

	/* translation */
	translation->x = self->c30;
	translation->y = self->c31;
	translation->z = self->c32;

	/*
	 * self->c00 = scale->x;
	 * self->c11 = scale->y;
	 * self->c22 = scale->z;
	 */

	/* sign */
	signx = ((self->c00 * self->c01 * self->c02 * self->c03) < 0) ? -1.0f : 1.0f;
	signy = ((self->c10 * self->c11 * self->c12 * self->c13) < 0) ? -1.0f : 1.0f;
	signz = ((self->c20 * self->c21 * self->c22 * self->c23) < 0) ? -1.0f : 1.0f;

	/* scale */
	scale->x = signx * HYP_SQRT(self->c00 * self->c00 + self->c01 * self->c01 + self->c02 * self->c02);
	scale->y = signy * HYP_SQRT(self->c10 * self->c10 + self->c11 * self->c11 + self->c12 * self->c12);
	scale->z = signz * HYP_SQRT(self->c20 * self->c20 + self->c21 * self->c21 + self->c22 * self->c22);

	/* todo */
	quaternion_identity(rotation);

	return 1;
}